

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deArrayBuffer.hpp
# Opt level: O2

ArrayBuffer<unsigned_char,_1UL,_1UL> * __thiscall
de::ArrayBuffer<unsigned_char,_1UL,_1UL>::operator=
          (ArrayBuffer<unsigned_char,_1UL,_1UL> *this,ArrayBuffer<unsigned_char,_1UL,_1UL> *other)

{
  void *pvVar1;
  size_t sVar2;
  ArrayBuffer<unsigned_char,_1UL,_1UL> copied;
  ArrayBuffer<unsigned_char,_1UL,_1UL> local_20;
  
  ArrayBuffer(&local_20,other);
  pvVar1 = this->m_ptr;
  sVar2 = this->m_cap;
  this->m_ptr = local_20.m_ptr;
  this->m_cap = local_20.m_cap;
  local_20.m_ptr = pvVar1;
  local_20.m_cap = sVar2;
  clear(&local_20);
  return this;
}

Assistant:

ArrayBuffer<T,Alignment,Stride>& ArrayBuffer<T,Alignment,Stride>::operator= (const ArrayBuffer& other)
{
	ArrayBuffer copied(other);
	swap(copied);
	return *this;
}